

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarCec(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConfLimit,int fPartition,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Aig_Man_t *pMan1_00;
  Aig_Man_t *pMan2_00;
  int *piVar3;
  abctime aVar4;
  abctime clkTotal;
  Abc_Ntk_t *pAStack_50;
  int RetValue;
  Abc_Ntk_t *pMiter;
  Aig_Man_t *pMan2;
  Aig_Man_t *pMan1;
  Aig_Man_t *pMan;
  int local_28;
  int fVerbose_local;
  int fPartition_local;
  int nConfLimit_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pMan._4_4_ = fVerbose;
  local_28 = fPartition;
  fVerbose_local = nConfLimit;
  _fPartition_local = pNtk2;
  pNtk2_local = pNtk1;
  aVar2 = Abc_Clock();
  if ((_fPartition_local == (Abc_Ntk_t *)0x0) && (local_28 == 1)) {
    Abc_Print(1,"Abc_NtkDarCec(): Switching to non-partitioned CEC for the miter.\n");
    local_28 = 0;
  }
  if (local_28 == 0) {
    if (_fPartition_local == (Abc_Ntk_t *)0x0) {
      pAStack_50 = Abc_NtkDup(pNtk2_local);
    }
    else {
      pAStack_50 = Abc_NtkMiter(pNtk2_local,_fPartition_local,0,0,0,0);
      if (pAStack_50 == (Abc_Ntk_t *)0x0) {
        Abc_Print(1,"Miter computation has failed.\n");
        return 0;
      }
    }
    iVar1 = Abc_NtkMiterIsConstant(pAStack_50);
    if (iVar1 == 0) {
      Abc_Print(1,"Networks are NOT EQUIVALENT after structural hashing.\n");
      if (_fPartition_local == (Abc_Ntk_t *)0x0) {
        piVar3 = Abc_NtkVerifyGetCleanModel(pNtk2_local,1);
        pNtk2_local->pModel = piVar3;
      }
      Abc_NtkDelete(pAStack_50);
      return 0;
    }
    if (iVar1 == 1) {
      Abc_NtkDelete(pAStack_50);
      Abc_Print(1,"Networks are equivalent after structural hashing.\n");
      return 1;
    }
    pMan1 = Abc_NtkToDar(pAStack_50,0,0);
    Abc_NtkDelete(pAStack_50);
    if (pMan1 == (Aig_Man_t *)0x0) {
      Abc_Print(1,"Converting miter into AIG has failed.\n");
      return -1;
    }
    clkTotal._4_4_ = Fra_FraigCec(&pMan1,100000,pMan._4_4_);
    if (_fPartition_local == (Abc_Ntk_t *)0x0) {
      pNtk2_local->pModel = (int *)pMan1->pData;
      pMan1->pData = (void *)0x0;
    }
    Aig_ManStop(pMan1);
  }
  else {
    pMan1_00 = Abc_NtkToDar(pNtk2_local,0,0);
    pMan2_00 = Abc_NtkToDar(_fPartition_local,0,0);
    clkTotal._4_4_ = Fra_FraigCecPartitioned(pMan1_00,pMan2_00,fVerbose_local,100,1,pMan._4_4_);
    Aig_ManStop(pMan1_00);
    Aig_ManStop(pMan2_00);
  }
  if (clkTotal._4_4_ == 1) {
    Abc_Print(1,"Networks are equivalent.  ");
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar2) * 1.0) / 1000000.0);
  }
  else if (clkTotal._4_4_ == 0) {
    Abc_Print(1,"Networks are NOT EQUIVALENT.  ");
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar2) * 1.0) / 1000000.0);
  }
  else {
    Abc_Print(1,"Networks are UNDECIDED.  ");
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar2) * 1.0) / 1000000.0);
  }
  fflush(_stdout);
  return clkTotal._4_4_;
}

Assistant:

int Abc_NtkDarCec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConfLimit, int fPartition, int fVerbose )
{
    Aig_Man_t * pMan, * pMan1, * pMan2;
    Abc_Ntk_t * pMiter;
    int RetValue;
    abctime clkTotal = Abc_Clock();
/*
    {
    extern void Cec_ManVerifyTwoAigs( Aig_Man_t * pAig0, Aig_Man_t * pAig1, int fVerbose );
    Aig_Man_t * pAig0 = Abc_NtkToDar( pNtk1, 0, 0 );
    Aig_Man_t * pAig1 = Abc_NtkToDar( pNtk2, 0, 0 );
    Cec_ManVerifyTwoAigs( pAig0, pAig1, 1 );
    Aig_ManStop( pAig0 );
    Aig_ManStop( pAig1 );
    return 1;
    }
*/
    // cannot partition if it is already a miter
    if ( pNtk2 == NULL && fPartition == 1 )
    {
        Abc_Print( 1, "Abc_NtkDarCec(): Switching to non-partitioned CEC for the miter.\n" );
        fPartition = 0;
    }

    // if partitioning is selected, call partitioned CEC
    if ( fPartition )
    {
        pMan1 = Abc_NtkToDar( pNtk1, 0, 0 );
        pMan2 = Abc_NtkToDar( pNtk2, 0, 0 );
        RetValue = Fra_FraigCecPartitioned( pMan1, pMan2, nConfLimit, 100, 1, fVerbose );
        Aig_ManStop( pMan1 );
        Aig_ManStop( pMan2 );
        goto finish;
    }

    if ( pNtk2 != NULL )
    {
        // get the miter of the two networks
        pMiter = Abc_NtkMiter( pNtk1, pNtk2, 0, 0, 0, 0 );
        if ( pMiter == NULL )
        {
            Abc_Print( 1, "Miter computation has failed.\n" );
            return 0;
        }
    }
    else
    {
        pMiter = Abc_NtkDup( pNtk1 );
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
//        extern void Abc_NtkVerifyReportErrorSeq( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, int nFrames );
        Abc_Print( 1, "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        if ( pNtk2 == NULL )
            pNtk1->pModel = Abc_NtkVerifyGetCleanModel( pNtk1, 1 );
//        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, nFrames );
//        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, pMiter->pModel, nFrames );
//        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        Abc_Print( 1, "Networks are equivalent after structural hashing.\n" );
        return 1;
    }

    // derive the AIG manager
    pMan = Abc_NtkToDar( pMiter, 0, 0 );
    Abc_NtkDelete( pMiter );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    // perform verification
    RetValue = Fra_FraigCec( &pMan, 100000, fVerbose );
    // transfer model if given
    if ( pNtk2 == NULL )
        pNtk1->pModel = (int *)pMan->pData, pMan->pData = NULL;
    Aig_ManStop( pMan );

finish:
    // report the miter
    if ( RetValue == 1 )
    {
        Abc_Print( 1, "Networks are equivalent.  " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else if ( RetValue == 0 )
    {
        Abc_Print( 1, "Networks are NOT EQUIVALENT.  " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else
    {
        Abc_Print( 1, "Networks are UNDECIDED.  " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    fflush( stdout );
    return RetValue;
}